

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void discrete_dist_test_pdf<trng::binomial_dist>(binomial_dist *d)

{
  pointer pdVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double diff;
  AssertionHandler catchAssertionHandler;
  double local_d8 [2];
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  double *local_a8;
  char *local_a0;
  size_t sStack_98;
  double *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  if ((d->P).n_ < 0) {
    uVar3 = 0;
    uVar4 = 0x3ff00000;
  }
  else {
    dVar5 = *(d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = SUB84(dVar5,0);
    uVar4 = (undefined4)((ulong)dVar5 >> 0x20);
  }
  if ((double)CONCAT44(uVar4,uVar3) <= 0.95 && (double)CONCAT44(uVar4,uVar3) != 0.95) {
    lVar2 = 0;
    do {
      local_d8[0] = (double)CONCAT44(uVar4,uVar3);
      if (lVar2 != 0) {
        local_d8[0] = 1.0;
        if (lVar2 + -1 <= (long)(d->P).n_) {
          local_d8[0] = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar2 + -1];
        }
        local_d8[0] = (double)CONCAT44(uVar4,uVar3) - local_d8[0];
      }
      dVar5 = 0.0;
      if (lVar2 <= (d->P).n_) {
        if (lVar2 == 0) {
          dVar5 = *(d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          pdVar1 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar5 = pdVar1[lVar2] - pdVar1[lVar2 + -1];
        }
      }
      local_d8[0] = local_d8[0] - dVar5;
      local_b8._vptr_ITransientExpression = (_func_int **)0x2a8487;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_c8.line = 0xeb;
      Catch::StringRef::StringRef(&local_88,"diff < 128 * std::numeric_limits<double>::epsilon()");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_c8,local_88,Normal);
      dVar5 = local_d8[0];
      local_d8[1] = 2.842170943040401e-14;
      Catch::StringRef::StringRef((StringRef *)&local_c8,"<");
      local_b8.m_result = dVar5 < 2.842170943040401e-14;
      local_b8.m_isBinaryExpression = true;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_0031a2f8;
      local_a8 = local_d8;
      local_a0 = local_c8.file;
      sStack_98 = local_c8.line;
      local_90 = local_d8 + 1;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      uVar3 = 0;
      uVar4 = 0x3ff00000;
      if (lVar2 < (d->P).n_) {
        dVar5 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2 + 1];
        uVar3 = SUB84(dVar5,0);
        uVar4 = (undefined4)((ulong)dVar5 >> 0x20);
      }
      lVar2 = lVar2 + 1;
    } while ((double)CONCAT44(uVar4,uVar3) <= 0.95 && (double)CONCAT44(uVar4,uVar3) != 0.95);
  }
  return;
}

Assistant:

void discrete_dist_test_pdf(dist &d) {
  int i{d.min()};
  double P{d.cdf(i)};
  while (P < 0.95) {
    double p{P};
    if (i > d.min())
      p -= d.cdf(i - 1);
    const double diff{p - d.pdf(i)};
    REQUIRE(diff < 128 * std::numeric_limits<double>::epsilon());
    ++i;
    P = d.cdf(i);
  }
}